

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeKRMmatricesGlobal
          (ChElementShellANCF_3833 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor
          )

{
  long row;
  long row_00;
  double dVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  long lVar4;
  ulong index;
  long lVar5;
  long col;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar9 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar10 [64];
  ChVectorN<double,_(NSF_*_(NSF___1))___2>_conflict2 ScaledMassMatrix;
  int local_a44;
  double local_9f0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_300,_1,_0,_300,_1>_>,_const_Eigen::Matrix<double,_300,_1,_0,_300,_1>_>
  local_9e8;
  PlainObjectBase<Eigen::Matrix<double,300,1,0,300,1>> local_9c0 [2448];
  
  auVar10._8_56_ = in_register_00001248;
  auVar10._0_8_ = Rfactor;
  auVar9._8_56_ = in_register_00001208;
  auVar9._0_8_ = Kfactor;
  local_9f0 = Mfactor;
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value == 0x48) &&
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 0x48)) {
    if (this->m_method == ContInt) {
      auVar7._8_8_ = 0x8000000000000000;
      auVar7._0_8_ = 0x8000000000000000;
      auVar7 = vxorpd_avx512vl(auVar9._0_16_,auVar7);
      if (this->m_damping_enabled == true) {
        auVar8._8_8_ = 0x8000000000000000;
        auVar8._0_8_ = 0x8000000000000000;
        auVar8 = vxorpd_avx512vl(auVar10._0_16_,auVar8);
        ComputeInternalJacobianContIntDamping(this,H,auVar7._0_8_,auVar8._0_8_);
      }
      else {
        ComputeInternalJacobianContIntNoDamping(this,H,auVar7._0_8_);
      }
    }
    else {
      ComputeInternalJacobianPreInt(this,H,Kfactor,Rfactor);
    }
    Eigen::operator*(&local_9e8,&local_9f0,(StorageBaseType *)&this->m_MassMatrix);
    Eigen::PlainObjectBase<Eigen::Matrix<double,300,1,0,300,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,300,1,0,300,1>const>const,Eigen::Matrix<double,300,1,0,300,1>const>>
              (local_9c0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_300,_1,_0,_300,_1>_>,_const_Eigen::Matrix<double,_300,_1,_0,_300,_1>_>_>
                *)&local_9e8);
    lVar6 = 2;
    local_a44 = 0;
    for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 1) {
      row = lVar4 * 3 + 1;
      row_00 = lVar4 * 3 + 2;
      lVar5 = 0;
      for (col = lVar6; col != 0x4a; col = col + 3) {
        index = (ulong)(uint)(local_a44 + (int)lVar5);
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>,_1> *)
                            local_9c0,index);
        dVar1 = *pSVar2;
        pSVar3 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)H,lVar4 * 3,col + -2);
        *pSVar3 = dVar1 + *pSVar3;
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>,_1> *)
                            local_9c0,index);
        dVar1 = *pSVar2;
        pSVar3 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)H,row,col + -1);
        *pSVar3 = dVar1 + *pSVar3;
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>,_1> *)
                            local_9c0,index);
        dVar1 = *pSVar2;
        pSVar3 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)H,row_00,col);
        *pSVar3 = dVar1 + *pSVar3;
        if (lVar5 != 0) {
          pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>,_1> *)
                              local_9c0,index);
          dVar1 = *pSVar2;
          pSVar3 = Eigen::
                   DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                   ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                 *)H,col + -2,lVar4 * 3);
          *pSVar3 = dVar1 + *pSVar3;
          pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>,_1> *)
                              local_9c0,index);
          dVar1 = *pSVar2;
          pSVar3 = Eigen::
                   DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                   ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                 *)H,col + -1,row);
          *pSVar3 = dVar1 + *pSVar3;
          pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>,_1> *)
                              local_9c0,index);
          dVar1 = *pSVar2;
          pSVar3 = Eigen::
                   DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                   ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                 *)H,col,row_00);
          *pSVar3 = dVar1 + *pSVar3;
        }
        lVar5 = lVar5 + 1;
      }
      local_a44 = local_a44 + (int)lVar5;
      lVar6 = lVar6 + 3;
    }
    return;
  }
  __assert_fail("(H.rows() == 3 * NSF) && (H.cols() == 3 * NSF)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementShellANCF_3833.cpp"
                ,0x1f5,
                "virtual void chrono::fea::ChElementShellANCF_3833::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
               );
}

Assistant:

void ChElementShellANCF_3833::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 3 * NSF) && (H.cols() == 3 * NSF));

    if (m_method == IntFrcMethod::ContInt) {
        if (m_damping_enabled) {  // If linear Kelvin-Voigt viscoelastic material model is enabled
            ComputeInternalJacobianContIntDamping(H, -Kfactor, -Rfactor);
        } else {
            ComputeInternalJacobianContIntNoDamping(H, -Kfactor);
        }
    } else {
        ComputeInternalJacobianPreInt(H, Kfactor, Rfactor);
    }

    // Add in the Mass Matrix Which is Stored in Compact Upper Triangular Form
    ChVectorN<double, (NSF * (NSF + 1)) / 2> ScaledMassMatrix = Mfactor * m_MassMatrix;
    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            H(3 * i, 3 * j) += ScaledMassMatrix(idx);
            H(3 * i + 1, 3 * j + 1) += ScaledMassMatrix(idx);
            H(3 * i + 2, 3 * j + 2) += ScaledMassMatrix(idx);
            if (i != j) {
                H(3 * j, 3 * i) += ScaledMassMatrix(idx);
                H(3 * j + 1, 3 * i + 1) += ScaledMassMatrix(idx);
                H(3 * j + 2, 3 * i + 2) += ScaledMassMatrix(idx);
            }
            idx++;
        }
    }
}